

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O3

Reals __thiscall
Omega_h::coarsen_qualities(Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  Alloc *pAVar4;
  Omega_h_Parting OVar5;
  LO nmetrics;
  uint uVar6;
  undefined8 uVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  char *pcVar9;
  char *pcVar10;
  Reals RVar11;
  Write<int> cands2verts;
  LOs edges2verts;
  Read<double> metrics;
  LOs local_158;
  LOs local_148;
  LOs local_138;
  LOs local_128;
  LOs local_118;
  Write<int> local_108;
  Read<int> local_f8;
  Alloc *local_e8;
  void *local_e0;
  Alloc *local_d8;
  element_type *local_d0;
  Read<signed_char> local_c8;
  Read<signed_char> local_b8;
  Read<signed_char> local_a8;
  Read<signed_char> local_98;
  Reals local_88;
  Alloc *local_78;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  pointer psStack_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_58;
  Read<signed_char> local_40;
  void *pvVar8;
  
  OVar5 = Mesh::parting(mesh);
  if (OVar5 != OMEGA_H_GHOSTED) {
    fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
         ,0x42);
  }
  local_68._M_pi = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"metric","");
  Mesh::get_array<double>((Mesh *)&local_78,(Int)mesh,(string *)0x0);
  if (local_68._M_pi != &local_58) {
    operator_delete(local_68._M_pi,
                    (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_58._vptr__Sp_counted_base)->_M_ptr + 1));
  }
  nmetrics = Mesh::nverts(mesh);
  local_88.write_.shared_alloc_.alloc = local_78;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.write_.shared_alloc_.alloc = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  local_88.write_.shared_alloc_.direct_ptr = local_70;
  uVar6 = get_metrics_dim(nmetrics,&local_88);
  pAVar4 = local_88.write_.shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psStack_60 = (pointer)0x0;
  uVar3 = mesh->dim_;
  if (3 < uVar3) {
    uVar7 = 0x33;
    pcVar9 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    pcVar10 = "0 <= dim_ && dim_ <= 3";
LAB_0025926e:
    fail("assertion %s failed at %s +%d\n",pcVar10,pcVar9,uVar7);
  }
  if (uVar6 == 3 && (uVar3 ^ 3) == 0) {
    local_118.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_118.write_.shared_alloc_.alloc =
             (Alloc *)((local_118.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_118.write_.shared_alloc_.alloc)->use_count =
             (local_118.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_118.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_98.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
    if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
        local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_98.write_.shared_alloc_.alloc =
             (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_98.write_.shared_alloc_.alloc)->use_count =
             (local_98.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_98.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
    RVar11 = coarsen_qualities_tmpl<3,3>(this,mesh,&local_118,&local_98);
    pAVar4 = local_98.write_.shared_alloc_.alloc;
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    local_d8 = local_118.write_.shared_alloc_.alloc;
    if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
        local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX;
        local_d8 = local_118.write_.shared_alloc_.alloc;
      }
    }
  }
  else if (uVar6 == 2 && (uVar3 ^ 2) == 0) {
    local_128.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
        local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_128.write_.shared_alloc_.alloc =
             (Alloc *)((local_128.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_128.write_.shared_alloc_.alloc)->use_count =
             (local_128.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_128.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_a8.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
    if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8.write_.shared_alloc_.alloc =
             (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_a8.write_.shared_alloc_.alloc)->use_count =
             (local_a8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_a8.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
    RVar11 = coarsen_qualities_tmpl<2,2>(this,mesh,&local_128,&local_a8);
    pAVar4 = local_a8.write_.shared_alloc_.alloc;
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    local_d8 = local_128.write_.shared_alloc_.alloc;
    if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_00;
        local_d8 = local_128.write_.shared_alloc_.alloc;
      }
    }
  }
  else if ((uVar3 ^ 3) == 0 && (uVar6 ^ 1) == 0) {
    local_138.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
        local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_138.write_.shared_alloc_.alloc =
             (Alloc *)((local_138.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_138.write_.shared_alloc_.alloc)->use_count =
             (local_138.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_138.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_b8.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
    if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.write_.shared_alloc_.alloc =
             (Alloc *)((local_b8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b8.write_.shared_alloc_.alloc)->use_count =
             (local_b8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b8.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
    RVar11 = coarsen_qualities_tmpl<3,1>(this,mesh,&local_138,&local_b8);
    pAVar4 = local_b8.write_.shared_alloc_.alloc;
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    local_d8 = local_138.write_.shared_alloc_.alloc;
    if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_01;
        local_d8 = local_138.write_.shared_alloc_.alloc;
      }
    }
  }
  else if ((uVar6 ^ 1) == 0 && (uVar3 ^ 2) == 0) {
    local_148.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.write_.shared_alloc_.alloc)->use_count =
             (local_148.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_c8.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
    if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c8.write_.shared_alloc_.alloc =
             (Alloc *)((local_c8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_c8.write_.shared_alloc_.alloc)->use_count =
             (local_c8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_c8.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
    RVar11 = coarsen_qualities_tmpl<2,1>(this,mesh,&local_148,&local_c8);
    pAVar4 = local_c8.write_.shared_alloc_.alloc;
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    local_d8 = local_148.write_.shared_alloc_.alloc;
    if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_c8.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_02;
        local_d8 = local_148.write_.shared_alloc_.alloc;
      }
    }
  }
  else {
    if (uVar3 != 1) {
      uVar7 = 0x57;
      pcVar9 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
      ;
      pcVar10 = "false";
      goto LAB_0025926e;
    }
    Mesh::ask_verts_of((Mesh *)&local_d8,(Int)mesh);
    local_158.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
        local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_158.write_.shared_alloc_.alloc =
             (Alloc *)((local_158.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_158.write_.shared_alloc_.alloc)->use_count =
             (local_158.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_158.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_f8.write_.shared_alloc_.alloc = local_d8;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f8.write_.shared_alloc_.alloc = (Alloc *)(local_d8->size * 8 + 1);
      }
      else {
        local_d8->use_count = local_d8->use_count + 1;
      }
    }
    local_f8.write_.shared_alloc_.direct_ptr = local_d0;
    unmap<int>((Omega_h *)&local_e8,&local_158,&local_f8,2);
    pAVar4 = local_f8.write_.shared_alloc_.alloc;
    if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    pAVar4 = local_158.write_.shared_alloc_.alloc;
    if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
        local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    local_108.shared_alloc_.alloc = local_e8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_108.shared_alloc_.alloc = (Alloc *)(local_e8->size * 8 + 1);
      }
      else {
        local_e8->use_count = local_e8->use_count + 1;
      }
    }
    local_108.shared_alloc_.direct_ptr = local_e0;
    Read<int>::Read(&local_40,&local_108);
    RVar11 = get_1d_cavity_qualities(this,mesh,0,(LOs *)&local_40);
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
        local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_40.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
        operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
        pvVar8 = extraout_RDX_03;
      }
    }
    pAVar4 = local_108.shared_alloc_.alloc;
    if (((ulong)local_108.shared_alloc_.alloc & 7) == 0 &&
        local_108.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_108.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_108.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_04;
      }
    }
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      piVar1 = &local_e8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e8);
        operator_delete(local_e8,0x48);
        pvVar8 = extraout_RDX_05;
      }
    }
  }
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    piVar1 = &local_d8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8);
      operator_delete(local_d8,0x48);
      pvVar8 = extraout_RDX_06;
    }
  }
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    piVar1 = &local_78->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78);
      operator_delete(local_78,0x48);
      pvVar8 = extraout_RDX_07;
    }
  }
  RVar11.write_.shared_alloc_.direct_ptr = pvVar8;
  RVar11.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar11.write_.shared_alloc_;
}

Assistant:

Reals coarsen_qualities(Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto metrics = mesh->get_array<Real>(VERT, "metric");
  auto metric_dim = get_metrics_dim(mesh->nverts(), metrics);
  auto cand_quals = Reals();
  if (mesh->dim() == 3 && metric_dim == 3) {
    return coarsen_qualities_tmpl<3, 3>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2 && metric_dim == 2) {
    return coarsen_qualities_tmpl<2, 2>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 3 && metric_dim == 1) {
    return coarsen_qualities_tmpl<3, 1>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2 && metric_dim == 1) {
    return coarsen_qualities_tmpl<2, 1>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 1) {
    auto edges2verts = mesh->ask_verts_of(EDGE);
    auto cands2verts = unmap(cands2edges, edges2verts, 2);
    return get_1d_cavity_qualities(mesh, VERT, cands2verts);
  }
  OMEGA_H_NORETURN(Reals());
}